

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_miniz.h
# Opt level: O0

tinfl_status
tinfl_decompress(tinfl_decompressor *r,mz_uint8 *pIn_buf_next,size_t *pIn_buf_size,
                mz_uint8 *pOut_buf_start,mz_uint8 *pOut_buf_next,size_t *pOut_buf_size,
                mz_uint32 decomp_flags)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  byte *pbVar9;
  mz_uint8 *pmVar10;
  mz_uint8 *pmVar11;
  mz_uint8 *pmVar12;
  byte bVar13;
  uint uVar14;
  mz_uint mVar15;
  mz_uint mVar16;
  bool bVar17;
  mz_uint8 *local_2a0;
  bool local_289;
  bool local_261;
  uint local_254;
  bool local_239;
  size_t local_230;
  size_t local_228;
  ulong local_220;
  bool local_212;
  bool local_211;
  mz_uint8 *local_208;
  ulong local_200;
  size_t block_len;
  uint local_1f0;
  mz_uint32 s2;
  mz_uint32 s1;
  mz_uint32 i_2;
  size_t buf_len;
  mz_uint8 *ptr;
  uint local_1d0;
  mz_uint c_13;
  mz_uint s_2;
  mz_uint c_12;
  mz_uint c_11;
  mz_uint extra_bits_1;
  mz_uint c_10;
  mz_uint code_len_3;
  int temp_2;
  mz_uint c_9;
  mz_uint extra_bits;
  mz_uint code_len_2;
  int sym2;
  mz_uint c_8;
  mz_uint code_len_1;
  int temp_1;
  mz_uint8 *pSrc;
  mz_uint c_7;
  mz_uint c_6;
  mz_uint code_len;
  int temp;
  mz_uint s_1;
  mz_uint mStack_174;
  mz_int16 k;
  mz_uint code_size;
  mz_uint cur_code;
  mz_uint l;
  mz_uint rev_code;
  mz_uint total_syms [16];
  mz_uint next_code [17];
  mz_uint sym_index;
  mz_uint total;
  mz_uint used_syms;
  mz_uint j;
  mz_uint i_1;
  tinfl_huff_table *pTable;
  int tree_cur;
  int tree_next;
  mz_uint c_5;
  mz_uint s;
  mz_uint c_4;
  mz_uint i;
  mz_uint8 *p;
  size_t n;
  mz_uint c_3;
  mz_uint c_2;
  mz_uint c_1;
  mz_uint c;
  size_t dist_from_out_buf_start;
  size_t out_buf_size_mask;
  mz_uint8 *pOut_buf_end;
  mz_uint8 *pOut_buf_cur;
  mz_uint8 *pIn_buf_end;
  mz_uint8 *pIn_buf_cur;
  tinfl_bit_buf_t bit_buf;
  uint local_50;
  mz_uint32 num_extra;
  mz_uint32 counter;
  mz_uint32 dist;
  mz_uint32 num_bits;
  tinfl_status status;
  size_t *pOut_buf_size_local;
  mz_uint8 *pOut_buf_next_local;
  mz_uint8 *pOut_buf_start_local;
  size_t *pIn_buf_size_local;
  mz_uint8 *pIn_buf_next_local;
  tinfl_decompressor *r_local;
  
  dist = 0xffffffff;
  pbVar9 = pIn_buf_next + *pIn_buf_size;
  pmVar10 = pOut_buf_next + *pOut_buf_size;
  if ((decomp_flags & 4) == 0) {
    local_208 = pOut_buf_next + (*pOut_buf_size - (long)pOut_buf_start) + -1;
  }
  else {
    local_208 = (mz_uint8 *)0xffffffffffffffff;
  }
  if ((((ulong)(local_208 + 1) & (ulong)local_208) != 0) || (pOut_buf_next < pOut_buf_start)) {
    *pOut_buf_size = 0;
    *pIn_buf_size = 0;
    return TINFL_STATUS_BAD_PARAM;
  }
  counter = r->m_num_bits;
  pIn_buf_cur = (mz_uint8 *)r->m_bit_buf;
  num_extra = r->m_dist;
  local_50 = r->m_counter;
  bit_buf._4_4_ = r->m_num_extra;
  _c_1 = r->m_dist_from_out_buf_start;
  pOut_buf_end = pOut_buf_next;
  pIn_buf_end = pIn_buf_next;
  switch(r->m_state) {
  case 0:
    r->m_zhdr1 = 0;
    r->m_zhdr0 = 0;
    bit_buf._4_4_ = 0;
    local_50 = 0;
    num_extra = 0;
    counter = 0;
    pIn_buf_cur = (mz_uint8 *)0x0;
    r->m_check_adler32 = 1;
    r->m_z_adler32 = 1;
    pbVar1 = pIn_buf_next;
    if ((decomp_flags & 1) != 0) {
      if (pbVar9 <= pIn_buf_next) goto LAB_0012429a;
      pIn_buf_end = pIn_buf_next + 1;
      r->m_zhdr0 = (uint)*pIn_buf_next;
      goto LAB_00124310;
    }
    goto joined_r0x00124498;
  case 1:
    if (pIn_buf_next < pbVar9) {
      pIn_buf_end = pIn_buf_next + 1;
      r->m_zhdr0 = (uint)*pIn_buf_next;
    }
    else {
LAB_0012429a:
      if ((decomp_flags & 2) != 0) {
        dist = 1;
        r->m_state = 1;
        break;
      }
      r->m_zhdr0 = 0;
    }
LAB_00124310:
    if (pIn_buf_end < pbVar9) {
      r->m_zhdr1 = (uint)*pIn_buf_end;
      pIn_buf_end = pIn_buf_end + 1;
    }
    else {
LAB_00124320:
      if ((decomp_flags & 2) != 0) {
        dist = 1;
        r->m_state = 2;
        break;
      }
      r->m_zhdr1 = 0;
    }
    goto LAB_00124396;
  case 2:
    if (pbVar9 <= pIn_buf_next) goto LAB_00124320;
    pIn_buf_end = pIn_buf_next + 1;
    r->m_zhdr1 = (uint)*pIn_buf_next;
LAB_00124396:
    local_211 = true;
    if (((r->m_zhdr0 * 0x100 + r->m_zhdr1) % 0x1f == 0) &&
       (local_211 = true, (r->m_zhdr1 & 0x20) == 0)) {
      local_211 = (r->m_zhdr0 & 0xf) != 8;
    }
    if ((decomp_flags & 4) == 0) {
      local_212 = true;
      if ((uint)(1 << ((char)(r->m_zhdr0 >> 4) + 8U & 0x1f)) < 0x8001) {
        local_212 = local_208 + 1 <
                    (mz_uint8 *)(ulong)(uint)(1 << ((char)(r->m_zhdr0 >> 4) + 8U & 0x1f));
      }
      local_211 = (bool)(local_212 | local_211);
    }
    local_50 = (uint)local_211;
    pbVar1 = pIn_buf_end;
    if (local_50 == 0) {
joined_r0x00124498:
      do {
        for (; pIn_buf_end = pbVar1, counter < 3; counter = counter + 8) {
          if (pbVar1 < pbVar9) {
            pIn_buf_end = pbVar1 + 1;
            c_2 = (mz_uint)*pbVar1;
          }
          else {
LAB_001244ae:
            if ((decomp_flags & 2) != 0) {
              dist = 1;
              r->m_state = 3;
              goto LAB_00126935;
            }
            c_2 = 0;
          }
LAB_00124521:
          pIn_buf_cur = (mz_uint8 *)((ulong)c_2 << ((byte)counter & 0x3f) | (ulong)pIn_buf_cur);
          pbVar1 = pIn_buf_end;
        }
        r->m_final = (uint)pIn_buf_cur & 7;
        pIn_buf_cur = (mz_uint8 *)((ulong)pIn_buf_cur >> 3);
        counter = counter - 3;
        r->m_type = r->m_final >> 1;
        if (r->m_type == 0) {
          if (counter < (counter & 7)) {
            do {
              if (pIn_buf_end < pbVar9) {
                c_3 = (mz_uint)*pIn_buf_end;
                pIn_buf_end = pIn_buf_end + 1;
              }
              else {
LAB_001245b3:
                if ((decomp_flags & 2) != 0) {
                  dist = 1;
                  r->m_state = 5;
                  goto LAB_00126935;
                }
                c_3 = 0;
              }
LAB_00124626:
              pIn_buf_cur = (mz_uint8 *)((ulong)c_3 << ((byte)counter & 0x3f) | (ulong)pIn_buf_cur);
              counter = counter + 8;
            } while (counter < (counter & 7));
          }
          pIn_buf_cur = (mz_uint8 *)((ulong)pIn_buf_cur >> ((byte)counter & 7));
          counter = counter - (counter & 7);
          for (local_50 = 0; local_50 < 4; local_50 = local_50 + 1) {
            pbVar1 = pIn_buf_end;
            if (counter == 0) {
              if (pIn_buf_end < pbVar9) {
                r->m_raw_header[local_50] = *pIn_buf_end;
                pIn_buf_end = pIn_buf_end + 1;
              }
              else {
LAB_00124790:
                if ((decomp_flags & 2) != 0) {
                  dist = 1;
                  r->m_state = 7;
                  goto LAB_00126935;
                }
                r->m_raw_header[local_50] = '\0';
              }
            }
            else {
              for (; pIn_buf_end = pbVar1, counter < 8; counter = counter + 8) {
                if (pbVar1 < pbVar9) {
                  pIn_buf_end = pbVar1 + 1;
                  n._4_4_ = (uint)*pbVar1;
                }
                else {
LAB_001246b0:
                  if ((decomp_flags & 2) != 0) {
                    dist = 1;
                    r->m_state = 6;
                    goto LAB_00126935;
                  }
                  n._4_4_ = 0;
                }
LAB_00124723:
                pIn_buf_cur = (mz_uint8 *)
                              ((ulong)n._4_4_ << ((byte)counter & 0x3f) | (ulong)pIn_buf_cur);
                pbVar1 = pIn_buf_end;
              }
              r->m_raw_header[local_50] = (mz_uint8)pIn_buf_cur;
              pIn_buf_cur = (mz_uint8 *)((ulong)pIn_buf_cur >> 8);
              counter = counter - 8;
            }
LAB_0012481a:
          }
          local_50 = (uint)*(ushort *)r->m_raw_header;
          if (local_50 != (*(ushort *)(r->m_raw_header + 2) ^ 0xffff)) goto LAB_00124871;
          for (; pbVar1 = pIn_buf_end, local_50 != 0 && counter != 0; local_50 = local_50 - 1) {
            for (; pIn_buf_end = pbVar1, counter < 8; counter = counter + 8) {
              if (pbVar1 < pbVar9) {
                pIn_buf_end = pbVar1 + 1;
                n._0_4_ = (uint)*pbVar1;
              }
              else {
LAB_001248d5:
                if ((decomp_flags & 2) != 0) {
                  dist = 1;
                  r->m_state = 0x33;
                  goto LAB_00126935;
                }
                n._0_4_ = 0;
              }
LAB_00124948:
              pIn_buf_cur = (mz_uint8 *)
                            ((ulong)(uint)n << ((byte)counter & 0x3f) | (ulong)pIn_buf_cur);
              pbVar1 = pIn_buf_end;
            }
            num_extra = (uint)pIn_buf_cur & 0xff;
            pIn_buf_cur = (mz_uint8 *)((ulong)pIn_buf_cur >> 8);
            counter = counter - 8;
LAB_00124997:
            if (pmVar10 <= pOut_buf_end) {
              dist = 2;
              r->m_state = 0x34;
              goto LAB_00126935;
            }
            *pOut_buf_end = (mz_uint8)num_extra;
            pOut_buf_end = pOut_buf_end + 1;
          }
          for (; local_50 != 0; local_50 = local_50 - (int)local_230) {
LAB_001249ef:
            if (pmVar10 <= pOut_buf_end) {
              dist = 2;
              r->m_state = 9;
              goto LAB_00126935;
            }
LAB_00124a17:
            if (pbVar9 <= pIn_buf_end) {
              if ((decomp_flags & 2) == 0) goto LAB_00124a4c;
              dist = 1;
              r->m_state = 0x26;
              goto LAB_00126935;
            }
            if ((ulong)((long)pmVar10 - (long)pOut_buf_end) <
                (ulong)((long)pbVar9 - (long)pIn_buf_end)) {
              local_220 = (long)pmVar10 - (long)pOut_buf_end;
            }
            else {
              local_220 = (long)pbVar9 - (long)pIn_buf_end;
            }
            if (local_220 < local_50) {
              if ((ulong)((long)pmVar10 - (long)pOut_buf_end) <
                  (ulong)((long)pbVar9 - (long)pIn_buf_end)) {
                local_228 = (long)pmVar10 - (long)pOut_buf_end;
              }
              else {
                local_228 = (long)pbVar9 - (long)pIn_buf_end;
              }
              local_230 = local_228;
            }
            else {
              local_230 = (size_t)local_50;
            }
            memcpy(pOut_buf_end,pIn_buf_end,local_230);
            pIn_buf_end = pIn_buf_end + local_230;
            pOut_buf_end = pOut_buf_end + local_230;
          }
        }
        else {
          if (r->m_type == 3) goto LAB_00124b7e;
          if (r->m_type == 1) {
            r->m_table_sizes[0] = 0x120;
            r->m_table_sizes[1] = 0x20;
            memset(r->m_tables + 1,5,0x20);
            _c_4 = r->m_tables;
            for (s = 0; s < 0x90; s = s + 1) {
              _c_4->m_code_size[0] = '\b';
              _c_4 = (tinfl_huff_table *)(_c_4->m_code_size + 1);
            }
            for (; s < 0x100; s = s + 1) {
              _c_4->m_code_size[0] = '\t';
              _c_4 = (tinfl_huff_table *)(_c_4->m_code_size + 1);
            }
            for (; s < 0x118; s = s + 1) {
              _c_4->m_code_size[0] = '\a';
              _c_4 = (tinfl_huff_table *)(_c_4->m_code_size + 1);
            }
            for (; s < 0x120; s = s + 1) {
              _c_4->m_code_size[0] = '\b';
              _c_4 = (tinfl_huff_table *)(_c_4->m_code_size + 1);
            }
          }
          else {
            for (local_50 = 0; local_50 < 3; local_50 = local_50 + 1) {
              if (counter < (uint)(int)"\x05\x05\x04"[local_50]) {
                do {
                  if (pIn_buf_end < pbVar9) {
                    c_5 = (mz_uint)*pIn_buf_end;
                    pIn_buf_end = pIn_buf_end + 1;
                  }
                  else {
LAB_00124d12:
                    if ((decomp_flags & 2) != 0) {
                      dist = 1;
                      r->m_state = 0xb;
                      goto LAB_00126935;
                    }
                    c_5 = 0;
                  }
LAB_00124d85:
                  pIn_buf_cur = (mz_uint8 *)
                                ((ulong)c_5 << ((byte)counter & 0x3f) | (ulong)pIn_buf_cur);
                  counter = counter + 8;
                } while (counter < (uint)(int)"\x05\x05\x04"[local_50]);
              }
              r->m_table_sizes[local_50] =
                   (uint)pIn_buf_cur & (1 << ("\x05\x05\x04"[local_50] & 0x1fU)) - 1U;
              pIn_buf_cur = (mz_uint8 *)((ulong)pIn_buf_cur >> ("\x05\x05\x04"[local_50] & 0x3fU));
              counter = counter - (int)"\x05\x05\x04"[local_50];
              r->m_table_sizes[local_50] =
                   tinfl_decompress::s_min_table_sizes[local_50] + r->m_table_sizes[local_50];
            }
            memset(r->m_tables + 2,0,0x120);
            for (local_50 = 0; local_50 < r->m_table_sizes[2]; local_50 = local_50 + 1) {
              for (; counter < 3; counter = counter + 8) {
                if (pIn_buf_end < pbVar9) {
                  tree_cur = (int)*pIn_buf_end;
                  pIn_buf_end = pIn_buf_end + 1;
                }
                else {
LAB_00124ea3:
                  if ((decomp_flags & 2) != 0) {
                    dist = 1;
                    r->m_state = 0xe;
                    goto LAB_00126935;
                  }
                  tree_cur = 0;
                }
LAB_00124f16:
                pIn_buf_cur = (mz_uint8 *)
                              ((ulong)(uint)tree_cur << ((byte)counter & 0x3f) | (ulong)pIn_buf_cur)
                ;
              }
              bVar13 = (byte)pIn_buf_cur;
              pIn_buf_cur = (mz_uint8 *)((ulong)pIn_buf_cur >> 3);
              counter = counter - 3;
              r->m_tables[2].m_code_size["\x10\x11\x12"[local_50]] = bVar13 & 7;
            }
            r->m_table_sizes[2] = 0x13;
          }
          while (pmVar12 = pOut_buf_end, -1 < (int)r->m_type) {
            uVar14 = r->m_type;
            memset(&l,0,0x40);
            memset(r->m_tables[uVar14].m_look_up,0,0x800);
            memset(r->m_tables[uVar14].m_tree,0,0x480);
            for (used_syms = 0; used_syms < r->m_table_sizes[r->m_type]; used_syms = used_syms + 1)
            {
              bVar13 = r->m_tables[uVar14].m_code_size[used_syms];
              (&l)[bVar13] = (&l)[bVar13] + 1;
            }
            sym_index = 0;
            next_code[0x10] = 0;
            total_syms[0xf] = 0;
            total_syms[0xe] = 0;
            for (used_syms = 1; used_syms < 0x10; used_syms = used_syms + 1) {
              sym_index = (&l)[used_syms] + sym_index;
              next_code[0x10] = (next_code[0x10] + (&l)[used_syms]) * 2;
              total_syms[(ulong)(used_syms + 1) + 0xe] = next_code[0x10];
            }
            if ((next_code[0x10] != 0x10000) && (1 < sym_index)) goto LAB_00125117;
            pTable._4_4_ = -1;
            for (next_code[0xf] = 0; next_code[0xf] < r->m_table_sizes[r->m_type];
                next_code[0xf] = next_code[0xf] + 1) {
              cur_code = 0;
              bVar13 = r->m_tables[uVar14].m_code_size[next_code[0xf]];
              total = (mz_uint)bVar13;
              if (total != 0) {
                mStack_174 = total_syms[(ulong)total + 0xe];
                total_syms[(ulong)total + 0xe] = mStack_174 + 1;
                for (code_size = total; code_size != 0; code_size = code_size - 1) {
                  cur_code = cur_code << 1 | mStack_174 & 1;
                  mStack_174 = mStack_174 >> 1;
                }
                if (total < 0xb) {
                  for (; cur_code < 0x400; cur_code = (1 << (bVar13 & 0x1f)) + cur_code) {
                    r->m_tables[uVar14].m_look_up[cur_code] =
                         (ushort)bVar13 << 9 | (ushort)next_code[0xf];
                  }
                }
                else {
                  pTable._0_4_ = (int)r->m_tables[uVar14].m_look_up[cur_code & 0x3ff];
                  if ((int)pTable == 0) {
                    r->m_tables[uVar14].m_look_up[cur_code & 0x3ff] = (mz_int16)pTable._4_4_;
                    pTable._0_4_ = pTable._4_4_;
                    pTable._4_4_ = pTable._4_4_ + -2;
                  }
                  cur_code = cur_code >> 9;
                  for (; 0xb < total; total = total - 1) {
                    cur_code = cur_code >> 1;
                    iVar2 = (int)pTable - (cur_code & 1);
                    if (r->m_tables[uVar14].m_tree[-1 - iVar2] == 0) {
                      r->m_tables[uVar14].m_tree[-1 - iVar2] = (mz_int16)pTable._4_4_;
                      pTable._0_4_ = pTable._4_4_;
                      pTable._4_4_ = pTable._4_4_ + -2;
                    }
                    else {
                      pTable._0_4_ = (int)r->m_tables[uVar14].m_tree[-1 - iVar2];
                    }
                  }
                  r->m_tables[uVar14].m_tree[(int)(-1 - ((int)pTable - (cur_code >> 1 & 1)))] =
                       (ushort)next_code[0xf];
                }
              }
            }
            if (r->m_type == 2) {
              local_50 = 0;
              while (local_50 < r->m_table_sizes[0] + r->m_table_sizes[1]) {
                if (counter < 0xf) {
                  if ((long)pbVar9 - (long)pIn_buf_end < 2) {
                    do {
                      c_6 = (mz_uint)r->m_tables[2].m_look_up[(ulong)pIn_buf_cur & 0x3ff];
                      if ((int)c_6 < 0) {
                        if (10 < counter) {
                          c_7 = 10;
                          do {
                            c_6 = (mz_uint)r->m_tables[2].m_tree
                                           [(long)(int)(c_6 ^ 0xffffffff) +
                                            ((ulong)pIn_buf_cur >> ((byte)c_7 & 0x3f) & 1)];
                            local_239 = (int)c_6 < 0 && c_7 + 2 <= counter;
                            c_7 = c_7 + 1;
                          } while (local_239);
                          if (-1 < (int)c_6) break;
                        }
                      }
                      else if (((int)c_6 >> 9 != 0) && ((uint)((int)c_6 >> 9) <= counter)) break;
                      if (pIn_buf_end < pbVar9) {
                        pSrc._4_4_ = (uint)*pIn_buf_end;
                        pIn_buf_end = pIn_buf_end + 1;
                      }
                      else {
LAB_00125563:
                        if ((decomp_flags & 2) != 0) {
                          dist = 1;
                          r->m_state = 0x10;
                          goto LAB_00126935;
                        }
                        pSrc._4_4_ = 0;
                      }
LAB_001255d6:
                      pIn_buf_cur = (mz_uint8 *)
                                    ((ulong)pSrc._4_4_ << ((byte)counter & 0x3f) |
                                    (ulong)pIn_buf_cur);
                      counter = counter + 8;
                    } while (counter < 0xf);
                  }
                  else {
                    pIn_buf_cur = (mz_uint8 *)
                                  ((ulong)*pIn_buf_end << ((byte)counter & 0x3f) |
                                   (ulong)pIn_buf_end[1] << ((byte)counter + 8 & 0x3f) |
                                  (ulong)pIn_buf_cur);
                    pIn_buf_end = pIn_buf_end + 2;
                    counter = counter + 0x10;
                  }
                }
                c_6 = (mz_uint)r->m_tables[2].m_look_up[(ulong)pIn_buf_cur & 0x3ff];
                if ((int)c_6 < 0) {
                  c_7 = 10;
                  do {
                    mVar15 = c_7 + 1;
                    c_6 = (mz_uint)r->m_tables[2].m_tree
                                   [(long)(int)(c_6 ^ 0xffffffff) +
                                    ((ulong)pIn_buf_cur >> ((byte)c_7 & 0x3f) & 1)];
                    c_7 = mVar15;
                  } while ((int)c_6 < 0);
                }
                else {
                  c_7 = (int)c_6 >> 9;
                  c_6 = c_6 & 0x1ff;
                }
                num_extra = c_6;
                pIn_buf_cur = (mz_uint8 *)((ulong)pIn_buf_cur >> ((byte)c_7 & 0x3f));
                counter = counter - c_7;
                if (c_6 < 0x10) {
                  r->m_len_codes[local_50] = (mz_uint8)c_6;
                  local_50 = local_50 + 1;
                }
                else {
                  if ((c_6 == 0x10) && (local_50 == 0)) goto LAB_00125750;
                  bit_buf._4_4_ = (uint)"\x02\x03\a"[c_6 - 0x10];
                  if (counter < bit_buf._4_4_) {
                    do {
                      if (pIn_buf_end < pbVar9) {
                        pSrc._0_4_ = (uint)*pIn_buf_end;
                        pIn_buf_end = pIn_buf_end + 1;
                      }
                      else {
LAB_001257a0:
                        if ((decomp_flags & 2) != 0) {
                          dist = 1;
                          r->m_state = 0x12;
                          goto LAB_00126935;
                        }
                        pSrc._0_4_ = 0;
                      }
LAB_00125813:
                      pIn_buf_cur = (mz_uint8 *)
                                    ((ulong)(uint)pSrc << ((byte)counter & 0x3f) |
                                    (ulong)pIn_buf_cur);
                      counter = counter + 8;
                    } while (counter < bit_buf._4_4_);
                  }
                  uVar14 = (uint)pIn_buf_cur;
                  pIn_buf_cur = (mz_uint8 *)((ulong)pIn_buf_cur >> ((byte)bit_buf._4_4_ & 0x3f));
                  counter = counter - bit_buf._4_4_;
                  uVar14 = (int)"\x03\x03\v"[num_extra - 0x10] +
                           (uVar14 & (1 << ((byte)bit_buf._4_4_ & 0x1f)) - 1U);
                  if (num_extra == 0x10) {
                    local_254 = (uint)r->m_len_codes[local_50 - 1];
                  }
                  else {
                    local_254 = 0;
                  }
                  memset(r->m_len_codes + local_50,local_254,(ulong)uVar14);
                  local_50 = uVar14 + local_50;
                }
              }
              if (r->m_table_sizes[0] + r->m_table_sizes[1] != local_50) goto LAB_00125923;
              memcpy(r->m_tables,r->m_len_codes,(ulong)r->m_table_sizes[0]);
              memcpy(r->m_tables + 1,r->m_len_codes + r->m_table_sizes[0],(ulong)r->m_table_sizes[1]
                    );
            }
            r->m_type = r->m_type - 1;
          }
LAB_001259aa:
          while ((pOut_buf_end = pmVar12, bVar13 = (byte)counter,
                 (long)pbVar9 - (long)pIn_buf_end < 4 || ((long)pmVar10 - (long)pOut_buf_end < 2)))
          {
            if (counter < 0xf) {
              if ((long)pbVar9 - (long)pIn_buf_end < 2) {
                do {
                  c_8 = (mz_uint)r->m_tables[0].m_look_up[(ulong)pIn_buf_cur & 0x3ff];
                  if ((int)c_8 < 0) {
                    if (10 < counter) {
                      sym2 = 10;
                      do {
                        c_8 = (mz_uint)r->m_tables[0].m_tree
                                       [(long)(int)(c_8 ^ 0xffffffff) +
                                        ((ulong)pIn_buf_cur >> ((byte)sym2 & 0x3f) & 1)];
                        local_261 = (int)c_8 < 0 && sym2 + 2U <= counter;
                        sym2 = sym2 + 1;
                      } while (local_261);
                      if (-1 < (int)c_8) break;
                    }
                  }
                  else if (((int)c_8 >> 9 != 0) && ((uint)((int)c_8 >> 9) <= counter)) break;
                  if (pIn_buf_end < pbVar9) {
                    code_len_2 = (mz_uint)*pIn_buf_end;
                    pIn_buf_end = pIn_buf_end + 1;
                  }
                  else {
LAB_00125af9:
                    if ((decomp_flags & 2) != 0) {
                      dist = 1;
                      r->m_state = 0x17;
                      goto LAB_00126935;
                    }
                    code_len_2 = 0;
                  }
LAB_00125b6c:
                  pIn_buf_cur = (mz_uint8 *)
                                ((ulong)code_len_2 << ((byte)counter & 0x3f) | (ulong)pIn_buf_cur);
                  counter = counter + 8;
                } while (counter < 0xf);
              }
              else {
                pIn_buf_cur = (mz_uint8 *)
                              ((ulong)*pIn_buf_end << (bVar13 & 0x3f) |
                               (ulong)pIn_buf_end[1] << (bVar13 + 8 & 0x3f) | (ulong)pIn_buf_cur);
                pIn_buf_end = pIn_buf_end + 2;
                counter = counter + 0x10;
              }
            }
            c_8 = (mz_uint)r->m_tables[0].m_look_up[(ulong)pIn_buf_cur & 0x3ff];
            if ((int)c_8 < 0) {
              sym2 = 10;
              do {
                iVar2 = sym2 + 1;
                c_8 = (mz_uint)r->m_tables[0].m_tree
                               [(long)(int)(c_8 ^ 0xffffffff) +
                                ((ulong)pIn_buf_cur >> ((byte)sym2 & 0x3f) & 1)];
                sym2 = iVar2;
              } while ((int)c_8 < 0);
            }
            else {
              sym2 = (int)c_8 >> 9;
              c_8 = c_8 & 0x1ff;
            }
            local_50 = c_8;
            pIn_buf_cur = (mz_uint8 *)((ulong)pIn_buf_cur >> ((byte)sym2 & 0x3f));
            counter = counter - sym2;
            if (0xff < c_8) goto LAB_00125f31;
LAB_00125cbe:
            if (pmVar10 <= pOut_buf_end) {
              dist = 2;
              r->m_state = 0x18;
              goto LAB_00126935;
            }
            *pOut_buf_end = (mz_uint8)local_50;
            pmVar12 = pOut_buf_end + 1;
          }
          if (counter < 0x1e) {
            pIn_buf_cur = (mz_uint8 *)
                          ((ulong)*(uint *)pIn_buf_end << (bVar13 & 0x3f) | (ulong)pIn_buf_cur);
            pIn_buf_end = pIn_buf_end + 4;
            counter = counter + 0x20;
          }
          extra_bits = (mz_uint)r->m_tables[0].m_look_up[(ulong)pIn_buf_cur & 0x3ff];
          if ((int)extra_bits < 0) {
            c_9 = 10;
            do {
              mVar15 = c_9 + 1;
              extra_bits = (mz_uint)r->m_tables[0].m_tree
                                    [(long)(int)(extra_bits ^ 0xffffffff) +
                                     ((ulong)pIn_buf_cur >> ((byte)c_9 & 0x3f) & 1)];
              c_9 = mVar15;
            } while ((int)extra_bits < 0);
          }
          else {
            c_9 = (int)extra_bits >> 9;
          }
          mVar15 = extra_bits;
          local_50 = extra_bits;
          pIn_buf_cur = (mz_uint8 *)((ulong)pIn_buf_cur >> ((byte)c_9 & 0x3f));
          counter = counter - c_9;
          if ((extra_bits & 0x100) == 0) {
            extra_bits = (mz_uint)r->m_tables[0].m_look_up[(ulong)pIn_buf_cur & 0x3ff];
            if ((int)extra_bits < 0) {
              c_9 = 10;
              do {
                mVar16 = c_9 + 1;
                extra_bits = (mz_uint)r->m_tables[0].m_tree
                                      [(long)(int)(extra_bits ^ 0xffffffff) +
                                       ((ulong)pIn_buf_cur >> ((byte)c_9 & 0x3f) & 1)];
                c_9 = mVar16;
              } while ((int)extra_bits < 0);
            }
            else {
              c_9 = (int)extra_bits >> 9;
            }
            pIn_buf_cur = (mz_uint8 *)((ulong)pIn_buf_cur >> ((byte)c_9 & 0x3f));
            counter = counter - c_9;
            *pOut_buf_end = (mz_uint8)mVar15;
            if ((extra_bits & 0x100) == 0) {
              pOut_buf_end[1] = (mz_uint8)extra_bits;
              pmVar12 = pOut_buf_end + 2;
              goto LAB_001259aa;
            }
            pOut_buf_end = pOut_buf_end + 1;
            local_50 = extra_bits;
          }
LAB_00125f31:
          local_50 = local_50 & 0x1ff;
          if (local_50 != 0x100) {
            bit_buf._4_4_ = tinfl_decompress::s_length_extra[local_50 - 0x101];
            local_50 = tinfl_decompress::s_length_base[local_50 - 0x101];
            if (bit_buf._4_4_ != 0) {
              if (counter < bit_buf._4_4_) {
                do {
                  if (pIn_buf_end < pbVar9) {
                    code_len_3 = (mz_uint)*pIn_buf_end;
                    pIn_buf_end = pIn_buf_end + 1;
                  }
                  else {
LAB_00125fa2:
                    if ((decomp_flags & 2) != 0) {
                      dist = 1;
                      r->m_state = 0x19;
                      goto LAB_00126935;
                    }
                    code_len_3 = 0;
                  }
LAB_00126015:
                  pIn_buf_cur = (mz_uint8 *)
                                ((ulong)code_len_3 << ((byte)counter & 0x3f) | (ulong)pIn_buf_cur);
                  counter = counter + 8;
                } while (counter < bit_buf._4_4_);
              }
              uVar14 = (uint)pIn_buf_cur;
              pIn_buf_cur = (mz_uint8 *)((ulong)pIn_buf_cur >> ((byte)bit_buf._4_4_ & 0x3f));
              counter = counter - bit_buf._4_4_;
              local_50 = (uVar14 & (1 << ((byte)bit_buf._4_4_ & 0x1f)) - 1U) + local_50;
            }
            if (counter < 0xf) {
              if ((long)pbVar9 - (long)pIn_buf_end < 2) {
                do {
                  c_10 = (mz_uint)r->m_tables[1].m_look_up[(ulong)pIn_buf_cur & 0x3ff];
                  if ((int)c_10 < 0) {
                    if (10 < counter) {
                      extra_bits_1 = 10;
                      do {
                        c_10 = (mz_uint)r->m_tables[1].m_tree
                                        [(long)(int)(c_10 ^ 0xffffffff) +
                                         ((ulong)pIn_buf_cur >> ((byte)extra_bits_1 & 0x3f) & 1)];
                        local_289 = (int)c_10 < 0 && extra_bits_1 + 2 <= counter;
                        extra_bits_1 = extra_bits_1 + 1;
                      } while (local_289);
                      if (-1 < (int)c_10) break;
                    }
                  }
                  else if (((int)c_10 >> 9 != 0) && ((uint)((int)c_10 >> 9) <= counter)) break;
                  if (pIn_buf_end < pbVar9) {
                    c_11 = (mz_uint)*pIn_buf_end;
                    pIn_buf_end = pIn_buf_end + 1;
                  }
                  else {
LAB_001261b1:
                    if ((decomp_flags & 2) != 0) {
                      dist = 1;
                      r->m_state = 0x1a;
                      goto LAB_00126935;
                    }
                    c_11 = 0;
                  }
LAB_00126224:
                  pIn_buf_cur = (mz_uint8 *)
                                ((ulong)c_11 << ((byte)counter & 0x3f) | (ulong)pIn_buf_cur);
                  counter = counter + 8;
                } while (counter < 0xf);
              }
              else {
                pIn_buf_cur = (mz_uint8 *)
                              ((ulong)*pIn_buf_end << ((byte)counter & 0x3f) |
                               (ulong)pIn_buf_end[1] << ((byte)counter + 8 & 0x3f) |
                              (ulong)pIn_buf_cur);
                pIn_buf_end = pIn_buf_end + 2;
                counter = counter + 0x10;
              }
            }
            c_10 = (mz_uint)r->m_tables[1].m_look_up[(ulong)pIn_buf_cur & 0x3ff];
            if ((int)c_10 < 0) {
              extra_bits_1 = 10;
              do {
                mVar15 = extra_bits_1 + 1;
                c_10 = (mz_uint)r->m_tables[1].m_tree
                                [(long)(int)(c_10 ^ 0xffffffff) +
                                 ((ulong)pIn_buf_cur >> ((byte)extra_bits_1 & 0x3f) & 1)];
                extra_bits_1 = mVar15;
              } while ((int)c_10 < 0);
            }
            else {
              extra_bits_1 = (int)c_10 >> 9;
              c_10 = c_10 & 0x1ff;
            }
            pIn_buf_cur = (mz_uint8 *)((ulong)pIn_buf_cur >> ((byte)extra_bits_1 & 0x3f));
            counter = counter - extra_bits_1;
            bit_buf._4_4_ = tinfl_decompress::s_dist_extra[c_10];
            num_extra = tinfl_decompress::s_dist_base[c_10];
            if (bit_buf._4_4_ != 0) {
              if (counter < bit_buf._4_4_) {
                do {
                  if (pIn_buf_end < pbVar9) {
                    s_2 = (mz_uint)*pIn_buf_end;
                    pIn_buf_end = pIn_buf_end + 1;
                  }
                  else {
LAB_001263b2:
                    if ((decomp_flags & 2) != 0) {
                      dist = 1;
                      r->m_state = 0x1b;
                      goto LAB_00126935;
                    }
                    s_2 = 0;
                  }
LAB_00126425:
                  pIn_buf_cur = (mz_uint8 *)
                                ((ulong)s_2 << ((byte)counter & 0x3f) | (ulong)pIn_buf_cur);
                  counter = counter + 8;
                } while (counter < bit_buf._4_4_);
              }
              uVar14 = (uint)pIn_buf_cur;
              pIn_buf_cur = (mz_uint8 *)((ulong)pIn_buf_cur >> ((byte)bit_buf._4_4_ & 0x3f));
              counter = counter - bit_buf._4_4_;
              num_extra = (uVar14 & (1 << ((byte)bit_buf._4_4_ & 0x1f)) - 1U) + num_extra;
            }
            _c_1 = (long)pOut_buf_end - (long)pOut_buf_start;
            if ((_c_1 < num_extra) && ((decomp_flags & 4) != 0)) goto LAB_001264c5;
            pmVar11 = pOut_buf_start + (_c_1 - num_extra & (ulong)local_208);
            local_2a0 = pmVar11;
            if (pmVar11 < pOut_buf_end) {
              local_2a0 = pOut_buf_end;
            }
            pmVar12 = pOut_buf_end;
            if (pmVar10 < local_2a0 + local_50) {
              while (uVar14 = local_50 - 1, bVar17 = local_50 != 0, pmVar12 = pOut_buf_end,
                    local_50 = uVar14, bVar17) {
LAB_0012654f:
                if (pmVar10 <= pOut_buf_end) {
                  dist = 2;
                  r->m_state = 0x35;
                  goto LAB_00126935;
                }
                *pOut_buf_end = pOut_buf_start[_c_1 - num_extra & (ulong)local_208];
                _c_1 = _c_1 + 1;
                pOut_buf_end = pOut_buf_end + 1;
              }
            }
            else {
              do {
                pOut_buf_end = pmVar12;
                _code_len_1 = pmVar11;
                *pOut_buf_end = *_code_len_1;
                pOut_buf_end[1] = _code_len_1[1];
                pOut_buf_end[2] = _code_len_1[2];
                pmVar12 = pOut_buf_end + 3;
                local_50 = local_50 - 3;
                pmVar11 = _code_len_1 + 3;
              } while (2 < (int)local_50);
              if (0 < (int)local_50) {
                *pmVar12 = _code_len_1[3];
                if (1 < (int)local_50) {
                  pOut_buf_end[4] = _code_len_1[4];
                }
                pmVar12 = pmVar12 + local_50;
              }
            }
            goto LAB_001259aa;
          }
          local_50 = 0x100;
        }
        pbVar1 = pIn_buf_end;
      } while ((r->m_final & 1) == 0);
      if ((decomp_flags & 1) != 0) {
        if (counter < (counter & 7)) {
          do {
            if (pIn_buf_end < pbVar9) {
              c_13 = (mz_uint)*pIn_buf_end;
              pIn_buf_end = pIn_buf_end + 1;
            }
            else {
LAB_001266a5:
              if ((decomp_flags & 2) != 0) {
                dist = 1;
                r->m_state = 0x20;
                goto LAB_00126935;
              }
              c_13 = 0;
            }
LAB_00126718:
            pIn_buf_cur = (mz_uint8 *)((ulong)c_13 << ((byte)counter & 0x3f) | (ulong)pIn_buf_cur);
            counter = counter + 8;
          } while (counter < (counter & 7));
        }
        pIn_buf_cur = (mz_uint8 *)((ulong)pIn_buf_cur >> ((byte)counter & 7));
        counter = counter - (counter & 7);
        for (local_50 = 0; local_50 < 4; local_50 = local_50 + 1) {
          pbVar1 = pIn_buf_end;
          if (counter == 0) {
            if (pIn_buf_end < pbVar9) {
              local_1d0 = (uint)*pIn_buf_end;
              pIn_buf_end = pIn_buf_end + 1;
            }
            else {
LAB_00126878:
              if ((decomp_flags & 2) != 0) {
                dist = 1;
                r->m_state = 0x2a;
                goto LAB_00126935;
              }
              local_1d0 = 0;
            }
          }
          else {
            for (; pIn_buf_end = pbVar1, counter < 8; counter = counter + 8) {
              if (pbVar1 < pbVar9) {
                pIn_buf_end = pbVar1 + 1;
                ptr._4_4_ = (uint)*pbVar1;
              }
              else {
LAB_001267a2:
                if ((decomp_flags & 2) != 0) {
                  dist = 1;
                  r->m_state = 0x29;
                  goto LAB_00126935;
                }
                ptr._4_4_ = 0;
              }
LAB_00126815:
              pIn_buf_cur = (mz_uint8 *)
                            ((ulong)ptr._4_4_ << ((byte)counter & 0x3f) | (ulong)pIn_buf_cur);
              pbVar1 = pIn_buf_end;
            }
            local_1d0 = (uint)pIn_buf_cur & 0xff;
            pIn_buf_cur = (mz_uint8 *)((ulong)pIn_buf_cur >> 8);
            counter = counter - 8;
          }
LAB_001268ef:
          r->m_z_adler32 = r->m_z_adler32 << 8 | local_1d0;
        }
      }
LAB_0012691a:
      dist = 0;
      r->m_state = 0x22;
    }
    else {
LAB_00124472:
      dist = 0xffffffff;
      r->m_state = 0x24;
    }
    break;
  case 3:
    pIn_buf_end = pIn_buf_next;
    if (pbVar9 <= pIn_buf_next) goto LAB_001244ae;
    pIn_buf_end = pIn_buf_next + 1;
    c_2 = (mz_uint)*pIn_buf_next;
    goto LAB_00124521;
  default:
    break;
  case 5:
    if (pbVar9 <= pIn_buf_next) goto LAB_001245b3;
    pIn_buf_end = pIn_buf_next + 1;
    c_3 = (mz_uint)*pIn_buf_next;
    goto LAB_00124626;
  case 6:
    pIn_buf_end = pIn_buf_next;
    if (pbVar9 <= pIn_buf_next) goto LAB_001246b0;
    pIn_buf_end = pIn_buf_next + 1;
    n._4_4_ = (uint)*pIn_buf_next;
    goto LAB_00124723;
  case 7:
    if (pbVar9 <= pIn_buf_next) goto LAB_00124790;
    pIn_buf_end = pIn_buf_next + 1;
    r->m_raw_header[local_50] = *pIn_buf_next;
    goto LAB_0012481a;
  case 9:
    goto LAB_001249ef;
  case 10:
    pIn_buf_end = pIn_buf_next;
LAB_00124b7e:
    dist = 0xffffffff;
    r->m_state = 10;
    break;
  case 0xb:
    if (pbVar9 <= pIn_buf_next) goto LAB_00124d12;
    pIn_buf_end = pIn_buf_next + 1;
    c_5 = (mz_uint)*pIn_buf_next;
    goto LAB_00124d85;
  case 0xe:
    if (pbVar9 <= pIn_buf_next) goto LAB_00124ea3;
    pIn_buf_end = pIn_buf_next + 1;
    tree_cur = (int)*pIn_buf_next;
    goto LAB_00124f16;
  case 0x10:
    if (pbVar9 <= pIn_buf_next) goto LAB_00125563;
    pIn_buf_end = pIn_buf_next + 1;
    pSrc._4_4_ = (uint)*pIn_buf_next;
    goto LAB_001255d6;
  case 0x11:
LAB_00125750:
    dist = 0xffffffff;
    r->m_state = 0x11;
    break;
  case 0x12:
    if (pbVar9 <= pIn_buf_next) goto LAB_001257a0;
    pIn_buf_end = pIn_buf_next + 1;
    pSrc._0_4_ = (uint)*pIn_buf_next;
    goto LAB_00125813;
  case 0x15:
LAB_00125923:
    dist = 0xffffffff;
    r->m_state = 0x15;
    break;
  case 0x17:
    if (pbVar9 <= pIn_buf_next) goto LAB_00125af9;
    pIn_buf_end = pIn_buf_next + 1;
    code_len_2 = (mz_uint)*pIn_buf_next;
    goto LAB_00125b6c;
  case 0x18:
    goto LAB_00125cbe;
  case 0x19:
    if (pbVar9 <= pIn_buf_next) goto LAB_00125fa2;
    pIn_buf_end = pIn_buf_next + 1;
    code_len_3 = (mz_uint)*pIn_buf_next;
    goto LAB_00126015;
  case 0x1a:
    if (pbVar9 <= pIn_buf_next) goto LAB_001261b1;
    pIn_buf_end = pIn_buf_next + 1;
    c_11 = (mz_uint)*pIn_buf_next;
    goto LAB_00126224;
  case 0x1b:
    if (pbVar9 <= pIn_buf_next) goto LAB_001263b2;
    pIn_buf_end = pIn_buf_next + 1;
    s_2 = (mz_uint)*pIn_buf_next;
    goto LAB_00126425;
  case 0x20:
    if (pbVar9 <= pIn_buf_next) goto LAB_001266a5;
    pIn_buf_end = pIn_buf_next + 1;
    c_13 = (mz_uint)*pIn_buf_next;
    goto LAB_00126718;
  case 0x22:
    goto LAB_0012691a;
  case 0x23:
LAB_00125117:
    dist = 0xffffffff;
    r->m_state = 0x23;
    break;
  case 0x24:
    goto LAB_00124472;
  case 0x25:
LAB_001264c5:
    dist = 0xffffffff;
    r->m_state = 0x25;
    break;
  case 0x26:
    goto LAB_00124a17;
  case 0x27:
LAB_00124871:
    dist = 0xffffffff;
    r->m_state = 0x27;
    break;
  case 0x28:
LAB_00124a4c:
    dist = 0xffffffff;
    r->m_state = 0x28;
    break;
  case 0x29:
    pIn_buf_end = pIn_buf_next;
    if (pbVar9 <= pIn_buf_next) goto LAB_001267a2;
    pIn_buf_end = pIn_buf_next + 1;
    ptr._4_4_ = (uint)*pIn_buf_next;
    goto LAB_00126815;
  case 0x2a:
    if (pbVar9 <= pIn_buf_next) goto LAB_00126878;
    pIn_buf_end = pIn_buf_next + 1;
    local_1d0 = (uint)*pIn_buf_next;
    goto LAB_001268ef;
  case 0x33:
    pIn_buf_end = pIn_buf_next;
    if (pbVar9 <= pIn_buf_next) goto LAB_001248d5;
    pIn_buf_end = pIn_buf_next + 1;
    n._0_4_ = (uint)*pIn_buf_next;
    goto LAB_00124948;
  case 0x34:
    goto LAB_00124997;
  case 0x35:
    goto LAB_0012654f;
  }
LAB_00126935:
  r->m_num_bits = counter;
  r->m_bit_buf = (tinfl_bit_buf_t)pIn_buf_cur;
  r->m_dist = num_extra;
  r->m_counter = local_50;
  r->m_num_extra = bit_buf._4_4_;
  r->m_dist_from_out_buf_start = _c_1;
  *pIn_buf_size = (long)pIn_buf_end - (long)pIn_buf_next;
  *pOut_buf_size = (long)pOut_buf_end - (long)pOut_buf_next;
  if (((decomp_flags & 9) != 0) && (-1 < (int)dist)) {
    _s1 = *pOut_buf_size;
    local_1f0 = r->m_check_adler32 & 0xffff;
    block_len._4_4_ = r->m_check_adler32 >> 0x10;
    local_200 = _s1 % 0x15b0;
    buf_len = (size_t)pOut_buf_next;
    while (_s1 != 0) {
      for (s2 = 0; s2 + 7 < local_200; s2 = s2 + 8) {
        iVar2 = *(byte *)buf_len + local_1f0;
        iVar3 = (uint)*(byte *)(buf_len + 1) + iVar2;
        iVar4 = (uint)*(byte *)(buf_len + 2) + iVar3;
        iVar5 = (uint)*(byte *)(buf_len + 3) + iVar4;
        iVar6 = (uint)*(byte *)(buf_len + 4) + iVar5;
        iVar7 = (uint)*(byte *)(buf_len + 5) + iVar6;
        iVar8 = (uint)*(byte *)(buf_len + 6) + iVar7;
        local_1f0 = (uint)*(byte *)(buf_len + 7) + iVar8;
        block_len._4_4_ =
             local_1f0 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 + block_len._4_4_;
        buf_len = buf_len + 8;
      }
      for (; s2 < local_200; s2 = s2 + 1) {
        local_1f0 = *(byte *)buf_len + local_1f0;
        block_len._4_4_ = local_1f0 + block_len._4_4_;
        buf_len = buf_len + 1;
      }
      local_1f0 = local_1f0 % 0xfff1;
      block_len._4_4_ = block_len._4_4_ % 0xfff1;
      _s1 = _s1 - local_200;
      local_200 = 0x15b0;
    }
    r->m_check_adler32 = block_len._4_4_ * 0x10000 + local_1f0;
    if (((dist == 0) && ((decomp_flags & 1) != 0)) && (r->m_check_adler32 != r->m_z_adler32)) {
      dist = 0xfffffffe;
    }
  }
  return dist;
}

Assistant:

static tinfl_status tinfl_decompress(tinfl_decompressor *r, const mz_uint8 *pIn_buf_next, size_t *pIn_buf_size, mz_uint8 *pOut_buf_start, mz_uint8 *pOut_buf_next, size_t *pOut_buf_size, const mz_uint32 decomp_flags)
{
  static const int s_length_base[31] = { 3,4,5,6,7,8,9,10,11,13, 15,17,19,23,27,31,35,43,51,59, 67,83,99,115,131,163,195,227,258,0,0 };
  static const int s_length_extra[31]= { 0,0,0,0,0,0,0,0,1,1,1,1,2,2,2,2,3,3,3,3,4,4,4,4,5,5,5,5,0,0,0 };
  static const int s_dist_base[32] = { 1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193, 257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577,0,0};
  static const int s_dist_extra[32] = { 0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,10,10,11,11,12,12,13,13};
  static const mz_uint8 s_length_dezigzag[19] = { 16,17,18,0,8,7,9,6,10,5,11,4,12,3,13,2,14,1,15 };
  static const int s_min_table_sizes[3] = { 257, 1, 4 };

  tinfl_status status = TINFL_STATUS_FAILED; mz_uint32 num_bits, dist, counter, num_extra; tinfl_bit_buf_t bit_buf;
  const mz_uint8 *pIn_buf_cur = pIn_buf_next, *const pIn_buf_end = pIn_buf_next + *pIn_buf_size;
  mz_uint8 *pOut_buf_cur = pOut_buf_next, *const pOut_buf_end = pOut_buf_next + *pOut_buf_size;
  size_t out_buf_size_mask = (decomp_flags & TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF) ? (size_t)-1 : ((pOut_buf_next - pOut_buf_start) + *pOut_buf_size) - 1, dist_from_out_buf_start;

  /* Ensure the output buffer's size is a power of 2, unless the output buffer is large enough to hold the entire output file (in which case it doesn't matter). */
  if (((out_buf_size_mask + 1) & out_buf_size_mask) || (pOut_buf_next < pOut_buf_start)) { *pIn_buf_size = *pOut_buf_size = 0; return TINFL_STATUS_BAD_PARAM; }

  num_bits = r->m_num_bits; bit_buf = r->m_bit_buf; dist = r->m_dist; counter = r->m_counter; num_extra = r->m_num_extra; dist_from_out_buf_start = r->m_dist_from_out_buf_start;
  TINFL_CR_BEGIN

  bit_buf = num_bits = dist = counter = num_extra = r->m_zhdr0 = r->m_zhdr1 = 0; r->m_z_adler32 = r->m_check_adler32 = 1;
  if (decomp_flags & TINFL_FLAG_PARSE_ZLIB_HEADER)
  {
    TINFL_GET_BYTE(1, r->m_zhdr0); TINFL_GET_BYTE(2, r->m_zhdr1);
    counter = (((r->m_zhdr0 * 256 + r->m_zhdr1) % 31 != 0) || (r->m_zhdr1 & 32) || ((r->m_zhdr0 & 15) != 8));
    if (!(decomp_flags & TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF)) counter |= (((1U << (8U + (r->m_zhdr0 >> 4))) > 32768U) || ((out_buf_size_mask + 1) < (size_t)(1U << (8U + (r->m_zhdr0 >> 4)))));
    if (counter) { TINFL_CR_RETURN_FOREVER(36, TINFL_STATUS_FAILED); }
  }

  do
  {
    TINFL_GET_BITS(3, r->m_final, 3); r->m_type = r->m_final >> 1;
    if (r->m_type == 0)
    {
      TINFL_SKIP_BITS(5, num_bits & 7);
      for (counter = 0; counter < 4; ++counter) { if (num_bits) TINFL_GET_BITS(6, r->m_raw_header[counter], 8); else TINFL_GET_BYTE(7, r->m_raw_header[counter]); }
      if ((counter = (r->m_raw_header[0] | (r->m_raw_header[1] << 8))) != (mz_uint)(0xFFFF ^ (r->m_raw_header[2] | (r->m_raw_header[3] << 8)))) { TINFL_CR_RETURN_FOREVER(39, TINFL_STATUS_FAILED); }
      while ((counter) && (num_bits))
      {
        TINFL_GET_BITS(51, dist, 8);
        while (pOut_buf_cur >= pOut_buf_end) { TINFL_CR_RETURN(52, TINFL_STATUS_HAS_MORE_OUTPUT); }
        *pOut_buf_cur++ = (mz_uint8)dist;
        counter--;
      }
      while (counter)
      {
        size_t n; while (pOut_buf_cur >= pOut_buf_end) { TINFL_CR_RETURN(9, TINFL_STATUS_HAS_MORE_OUTPUT); }
        while (pIn_buf_cur >= pIn_buf_end)
        {
          if (decomp_flags & TINFL_FLAG_HAS_MORE_INPUT)
          {
            TINFL_CR_RETURN(38, TINFL_STATUS_NEEDS_MORE_INPUT);
          }
          else
          {
            TINFL_CR_RETURN_FOREVER(40, TINFL_STATUS_FAILED);
          }
        }
        n = MZ_MIN(MZ_MIN((size_t)(pOut_buf_end - pOut_buf_cur), (size_t)(pIn_buf_end - pIn_buf_cur)), counter);
        TINFL_MEMCPY(pOut_buf_cur, pIn_buf_cur, n); pIn_buf_cur += n; pOut_buf_cur += n; counter -= (mz_uint)n;
      }
    }
    else if (r->m_type == 3)
    {
      TINFL_CR_RETURN_FOREVER(10, TINFL_STATUS_FAILED);
    }
    else
    {
      if (r->m_type == 1)
      {
        mz_uint8 *p = r->m_tables[0].m_code_size; mz_uint i;
        r->m_table_sizes[0] = 288; r->m_table_sizes[1] = 32; TINFL_MEMSET(r->m_tables[1].m_code_size, 5, 32);
        for ( i = 0; i <= 143; ++i) *p++ = 8;
        for ( ; i <= 255; ++i) *p++ = 9;
        for ( ; i <= 279; ++i) *p++ = 7;
        for ( ; i <= 287; ++i) *p++ = 8;
      }
      else
      {
        for (counter = 0; counter < 3; counter++) { TINFL_GET_BITS(11, r->m_table_sizes[counter], "\05\05\04"[counter]); r->m_table_sizes[counter] += s_min_table_sizes[counter]; }
        MZ_CLEAR_OBJ(r->m_tables[2].m_code_size); for (counter = 0; counter < r->m_table_sizes[2]; counter++) { mz_uint s; TINFL_GET_BITS(14, s, 3); r->m_tables[2].m_code_size[s_length_dezigzag[counter]] = (mz_uint8)s; }
        r->m_table_sizes[2] = 19;
      }
      for ( ; (int)r->m_type >= 0; r->m_type--)
      {
        int tree_next, tree_cur; tinfl_huff_table *pTable;
        mz_uint i, j, used_syms, total, sym_index, next_code[17], total_syms[16]; pTable = &r->m_tables[r->m_type]; MZ_CLEAR_OBJ(total_syms); MZ_CLEAR_OBJ(pTable->m_look_up); MZ_CLEAR_OBJ(pTable->m_tree);
        for (i = 0; i < r->m_table_sizes[r->m_type]; ++i) total_syms[pTable->m_code_size[i]]++;
        used_syms = 0, total = 0; next_code[0] = next_code[1] = 0;
        for (i = 1; i <= 15; ++i) { used_syms += total_syms[i]; next_code[i + 1] = (total = ((total + total_syms[i]) << 1)); }
        if ((65536 != total) && (used_syms > 1))
        {
          TINFL_CR_RETURN_FOREVER(35, TINFL_STATUS_FAILED);
        }
        for (tree_next = -1, sym_index = 0; sym_index < r->m_table_sizes[r->m_type]; ++sym_index)
        {
          mz_uint rev_code = 0, l, cur_code, code_size = pTable->m_code_size[sym_index]; if (!code_size) continue;
          cur_code = next_code[code_size]++; for (l = code_size; l > 0; l--, cur_code >>= 1) rev_code = (rev_code << 1) | (cur_code & 1);
          if (code_size <= TINFL_FAST_LOOKUP_BITS) { mz_int16 k = (mz_int16)((code_size << 9) | sym_index); while (rev_code < TINFL_FAST_LOOKUP_SIZE) { pTable->m_look_up[rev_code] = k; rev_code += (1 << code_size); } continue; }
          if (0 == (tree_cur = pTable->m_look_up[rev_code & (TINFL_FAST_LOOKUP_SIZE - 1)])) { pTable->m_look_up[rev_code & (TINFL_FAST_LOOKUP_SIZE - 1)] = (mz_int16)tree_next; tree_cur = tree_next; tree_next -= 2; }
          rev_code >>= (TINFL_FAST_LOOKUP_BITS - 1);
          for (j = code_size; j > (TINFL_FAST_LOOKUP_BITS + 1); j--)
          {
            tree_cur -= ((rev_code >>= 1) & 1);
            if (!pTable->m_tree[-tree_cur - 1]) { pTable->m_tree[-tree_cur - 1] = (mz_int16)tree_next; tree_cur = tree_next; tree_next -= 2; } else tree_cur = pTable->m_tree[-tree_cur - 1];
          }
          tree_cur -= ((rev_code >>= 1) & 1); pTable->m_tree[-tree_cur - 1] = (mz_int16)sym_index;
        }
        if (r->m_type == 2)
        {
          for (counter = 0; counter < (r->m_table_sizes[0] + r->m_table_sizes[1]); )
          {
            mz_uint s; TINFL_HUFF_DECODE(16, dist, &r->m_tables[2]); if (dist < 16) { r->m_len_codes[counter++] = (mz_uint8)dist; continue; }
            if ((dist == 16) && (!counter))
            {
              TINFL_CR_RETURN_FOREVER(17, TINFL_STATUS_FAILED);
            }
            num_extra = "\02\03\07"[dist - 16]; TINFL_GET_BITS(18, s, num_extra); s += "\03\03\013"[dist - 16];
            TINFL_MEMSET(r->m_len_codes + counter, (dist == 16) ? r->m_len_codes[counter - 1] : 0, s); counter += s;
          }
          if ((r->m_table_sizes[0] + r->m_table_sizes[1]) != counter)
          {
            TINFL_CR_RETURN_FOREVER(21, TINFL_STATUS_FAILED);
          }
          TINFL_MEMCPY(r->m_tables[0].m_code_size, r->m_len_codes, r->m_table_sizes[0]); TINFL_MEMCPY(r->m_tables[1].m_code_size, r->m_len_codes + r->m_table_sizes[0], r->m_table_sizes[1]);
        }
      }
      for ( ; ; )
      {
        mz_uint8 *pSrc;
        for ( ; ; )
        {
          if (((pIn_buf_end - pIn_buf_cur) < 4) || ((pOut_buf_end - pOut_buf_cur) < 2))
          {
            TINFL_HUFF_DECODE(23, counter, &r->m_tables[0]);
            if (counter >= 256)
              break;
            while (pOut_buf_cur >= pOut_buf_end) { TINFL_CR_RETURN(24, TINFL_STATUS_HAS_MORE_OUTPUT); }
            *pOut_buf_cur++ = (mz_uint8)counter;
          }
          else
          {
            int sym2; mz_uint code_len;
#if TINFL_USE_64BIT_BITBUF
            if (num_bits < 30) { bit_buf |= (((tinfl_bit_buf_t)MZ_READ_LE32(pIn_buf_cur)) << num_bits); pIn_buf_cur += 4; num_bits += 32; }
#else
            if (num_bits < 15) { bit_buf |= (((tinfl_bit_buf_t)MZ_READ_LE16(pIn_buf_cur)) << num_bits); pIn_buf_cur += 2; num_bits += 16; }
#endif
            if ((sym2 = r->m_tables[0].m_look_up[bit_buf & (TINFL_FAST_LOOKUP_SIZE - 1)]) >= 0)
              code_len = sym2 >> 9;
            else
            {
              code_len = TINFL_FAST_LOOKUP_BITS; do { sym2 = r->m_tables[0].m_tree[~sym2 + ((bit_buf >> code_len++) & 1)]; } while (sym2 < 0);
            }
            counter = sym2; bit_buf >>= code_len; num_bits -= code_len;
            if (counter & 256)
              break;

#if !TINFL_USE_64BIT_BITBUF
            if (num_bits < 15) { bit_buf |= (((tinfl_bit_buf_t)MZ_READ_LE16(pIn_buf_cur)) << num_bits); pIn_buf_cur += 2; num_bits += 16; }
#endif
            if ((sym2 = r->m_tables[0].m_look_up[bit_buf & (TINFL_FAST_LOOKUP_SIZE - 1)]) >= 0)
              code_len = sym2 >> 9;
            else
            {
              code_len = TINFL_FAST_LOOKUP_BITS; do { sym2 = r->m_tables[0].m_tree[~sym2 + ((bit_buf >> code_len++) & 1)]; } while (sym2 < 0);
            }
            bit_buf >>= code_len; num_bits -= code_len;

            pOut_buf_cur[0] = (mz_uint8)counter;
            if (sym2 & 256)
            {
              pOut_buf_cur++;
              counter = sym2;
              break;
            }
            pOut_buf_cur[1] = (mz_uint8)sym2;
            pOut_buf_cur += 2;
          }
        }
        if ((counter &= 511) == 256) break;

        num_extra = s_length_extra[counter - 257]; counter = s_length_base[counter - 257];
        if (num_extra) { mz_uint extra_bits; TINFL_GET_BITS(25, extra_bits, num_extra); counter += extra_bits; }

        TINFL_HUFF_DECODE(26, dist, &r->m_tables[1]);
        num_extra = s_dist_extra[dist]; dist = s_dist_base[dist];
        if (num_extra) { mz_uint extra_bits; TINFL_GET_BITS(27, extra_bits, num_extra); dist += extra_bits; }

        dist_from_out_buf_start = pOut_buf_cur - pOut_buf_start;
        if ((dist > dist_from_out_buf_start) && (decomp_flags & TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF))
        {
          TINFL_CR_RETURN_FOREVER(37, TINFL_STATUS_FAILED);
        }

        pSrc = pOut_buf_start + ((dist_from_out_buf_start - dist) & out_buf_size_mask);

        if ((MZ_MAX(pOut_buf_cur, pSrc) + counter) > pOut_buf_end)
        {
          while (counter--)
          {
            while (pOut_buf_cur >= pOut_buf_end) { TINFL_CR_RETURN(53, TINFL_STATUS_HAS_MORE_OUTPUT); }
            *pOut_buf_cur++ = pOut_buf_start[(dist_from_out_buf_start++ - dist) & out_buf_size_mask];
          }
          continue;
        }
#if MINIZ_USE_UNALIGNED_LOADS_AND_STORES
        else if ((counter >= 9) && (counter <= dist))
        {
          const mz_uint8 *pSrc_end = pSrc + (counter & ~7);
          do
          {
            ((mz_uint32 *)pOut_buf_cur)[0] = ((const mz_uint32 *)pSrc)[0];
            ((mz_uint32 *)pOut_buf_cur)[1] = ((const mz_uint32 *)pSrc)[1];
            pOut_buf_cur += 8;
          } while ((pSrc += 8) < pSrc_end);
          if ((counter &= 7) < 3)
          {
            if (counter)
            {
              pOut_buf_cur[0] = pSrc[0];
              if (counter > 1)
                pOut_buf_cur[1] = pSrc[1];
              pOut_buf_cur += counter;
            }
            continue;
          }
        }
#endif
        do
        {
          pOut_buf_cur[0] = pSrc[0];
          pOut_buf_cur[1] = pSrc[1];
          pOut_buf_cur[2] = pSrc[2];
          pOut_buf_cur += 3; pSrc += 3;
        } while ((int)(counter -= 3) > 2);
        if ((int)counter > 0)
        {
          pOut_buf_cur[0] = pSrc[0];
          if ((int)counter > 1)
            pOut_buf_cur[1] = pSrc[1];
          pOut_buf_cur += counter;
        }
      }
    }
  } while (!(r->m_final & 1));
  if (decomp_flags & TINFL_FLAG_PARSE_ZLIB_HEADER)
  {
    TINFL_SKIP_BITS(32, num_bits & 7); for (counter = 0; counter < 4; ++counter) { mz_uint s; if (num_bits) TINFL_GET_BITS(41, s, 8); else TINFL_GET_BYTE(42, s); r->m_z_adler32 = (r->m_z_adler32 << 8) | s; }
  }
  TINFL_CR_RETURN_FOREVER(34, TINFL_STATUS_DONE);
  TINFL_CR_FINISH

common_exit:
  r->m_num_bits = num_bits; r->m_bit_buf = bit_buf; r->m_dist = dist; r->m_counter = counter; r->m_num_extra = num_extra; r->m_dist_from_out_buf_start = dist_from_out_buf_start;
  *pIn_buf_size = pIn_buf_cur - pIn_buf_next; *pOut_buf_size = pOut_buf_cur - pOut_buf_next;
  if ((decomp_flags & (TINFL_FLAG_PARSE_ZLIB_HEADER | TINFL_FLAG_COMPUTE_ADLER32)) && (status >= 0))
  {
    const mz_uint8 *ptr = pOut_buf_next; size_t buf_len = *pOut_buf_size;
    mz_uint32 i, s1 = r->m_check_adler32 & 0xffff, s2 = r->m_check_adler32 >> 16; size_t block_len = buf_len % 5552;
    while (buf_len)
    {
      for (i = 0; i + 7 < block_len; i += 8, ptr += 8)
      {
        s1 += ptr[0], s2 += s1; s1 += ptr[1], s2 += s1; s1 += ptr[2], s2 += s1; s1 += ptr[3], s2 += s1;
        s1 += ptr[4], s2 += s1; s1 += ptr[5], s2 += s1; s1 += ptr[6], s2 += s1; s1 += ptr[7], s2 += s1;
      }
      for ( ; i < block_len; ++i) s1 += *ptr++, s2 += s1;
      s1 %= 65521U, s2 %= 65521U; buf_len -= block_len; block_len = 5552;
    }
    r->m_check_adler32 = (s2 << 16) + s1; if ((status == TINFL_STATUS_DONE) && (decomp_flags & TINFL_FLAG_PARSE_ZLIB_HEADER) && (r->m_check_adler32 != r->m_z_adler32)) status = TINFL_STATUS_ADLER32_MISMATCH;
  }
  return status;
}